

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundexFuzz.cpp
# Opt level: O3

void __thiscall SoundexFuzz_RandomizeAll_Test::TestBody(SoundexFuzz_RandomizeAll_Test *this)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  char *__end;
  int iVar4;
  string word;
  AssertHelper AStack_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar4 = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  do {
    iVar2 = rand();
    local_70[0].ptr_ = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"","");
    for (iVar2 = iVar2 % 6; iVar2 != 0; iVar2 = iVar2 + -1) {
      rand();
      std::__cxx11::string::push_back((char)(string *)local_70);
    }
    Soundex::encode((string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_70[0].ptr_ != local_60) {
      operator_delete(local_70[0].ptr_);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 100000);
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kSuccess,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kazz47[P]soundex/test/soundexFuzz.cpp"
             ,0x18,"Succeeded");
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if (((local_70[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_70[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_70[0].ptr_ + 8))();
  }
  return;
}

Assistant:

TEST(SoundexFuzz, RandomizeAll) {
    srand(time(NULL));

    for (int i = 0; i < 100000; i++) {
        unsigned int numChars = rand() % (int)(1.5 * Soundex::ENCODING_SIZE);

        string word = "";
        for (int i = 0; i < numChars; i++) {
            word += rand() % 256;
        }

        Soundex::encode(word);
    }

    SUCCEED();
}